

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.c
# Opt level: O0

size_t mdns_discovery_recv(int sock,void *buffer,size_t capacity,mdns_record_callback_fn callback,
                          void *user_data)

{
  uint16_t uVar1;
  int iVar2;
  ssize_t sVar3;
  uint32_t *puVar4;
  size_t sVar5;
  size_t local_e0;
  size_t offset;
  uint16_t local_d0;
  uint16_t length;
  uint32_t ttl;
  uint16_t rclass_1;
  uint16_t type_1;
  int is_answer;
  size_t verify_ofs_1;
  size_t ofs_1;
  int do_callback;
  uint16_t rclass;
  uint16_t type;
  size_t verify_ofs;
  size_t ofs;
  int i;
  uint16_t additional_rrs;
  uint16_t authority_rrs;
  uint16_t answer_rrs;
  uint16_t questions;
  uint16_t flags;
  uint16_t transaction_id;
  uint16_t *data;
  size_t records;
  size_t data_size;
  int ret;
  socklen_t addrlen;
  sockaddr *saddr;
  sockaddr_in6 addr;
  void *user_data_local;
  mdns_record_callback_fn callback_local;
  size_t capacity_local;
  void *buffer_local;
  size_t sStack_20;
  int sock_local;
  
  _ret = (sockaddr *)((long)&saddr + 4);
  addr._20_8_ = user_data;
  memset((void *)((long)&saddr + 4),0,0x1c);
  _ret->sa_family = 2;
  data_size._4_4_ = 0x1c;
  sVar3 = recvfrom(sock,buffer,capacity,0,_ret,(socklen_t *)((long)&data_size + 4));
  data_size._0_4_ = (int)sVar3;
  if ((int)data_size < 1) {
    sStack_20 = 0;
  }
  else {
    records = (size_t)(int)data_size;
    data = (uint16_t *)0x0;
    _answer_rrs = (uint32_t *)((long)buffer + 2);
    authority_rrs = ntohs(*buffer);
    uVar1 = *(uint16_t *)_answer_rrs;
    _answer_rrs = (uint32_t *)((long)_answer_rrs + 2);
    additional_rrs = ntohs(uVar1);
    uVar1 = *(uint16_t *)_answer_rrs;
    _answer_rrs = (uint32_t *)((long)_answer_rrs + 2);
    i._2_2_ = ntohs(uVar1);
    uVar1 = *(uint16_t *)_answer_rrs;
    _answer_rrs = (uint32_t *)((long)_answer_rrs + 2);
    i._0_2_ = ntohs(uVar1);
    uVar1 = *(uint16_t *)_answer_rrs;
    _answer_rrs = (uint32_t *)((long)_answer_rrs + 2);
    ofs._6_2_ = ntohs(uVar1);
    uVar1 = *(uint16_t *)_answer_rrs;
    _answer_rrs = (uint32_t *)((long)_answer_rrs + 2);
    ofs._4_2_ = ntohs(uVar1);
    if ((authority_rrs == 0) && (additional_rrs == 0x8400)) {
      if (i._2_2_ < 2) {
        for (ofs._0_4_ = 0; (int)ofs < (int)(uint)i._2_2_; ofs._0_4_ = (int)ofs + 1) {
          verify_ofs = (long)_answer_rrs - (long)buffer;
          _do_callback = 0xc;
          iVar2 = mdns_string_equal(buffer,records,&verify_ofs,"",0x2e,(size_t *)&do_callback);
          if (iVar2 == 0) {
            return 0;
          }
          _answer_rrs = (uint32_t *)((uint16_t *)((long)buffer + verify_ofs) + 1);
          ofs_1._6_2_ = ntohs(*(uint16_t *)((long)buffer + verify_ofs));
          uVar1 = *(uint16_t *)_answer_rrs;
          _answer_rrs = (uint32_t *)((long)_answer_rrs + 2);
          ofs_1._4_2_ = ntohs(uVar1);
          if ((ofs_1._6_2_ != 0xc) || ((ofs_1._4_2_ & 0x7fff) != 1)) {
            return 0;
          }
        }
        ofs_1._0_4_ = 1;
        for (ofs._0_4_ = 0; (int)ofs < (int)(uint)(uint16_t)i; ofs._0_4_ = (int)ofs + 1) {
          verify_ofs_1 = (long)_answer_rrs - (long)buffer;
          _rclass_1 = 0xc;
          ttl = mdns_string_equal(buffer,records,&verify_ofs_1,"",0x2e,(size_t *)&rclass_1);
          _answer_rrs = (uint32_t *)((uint16_t *)((long)buffer + verify_ofs_1) + 1);
          length = ntohs(*(uint16_t *)((long)buffer + verify_ofs_1));
          uVar1 = *(uint16_t *)_answer_rrs;
          _answer_rrs = (uint32_t *)((long)_answer_rrs + 2);
          local_d0 = ntohs(uVar1);
          offset._4_4_ = ntohl(*_answer_rrs);
          puVar4 = _answer_rrs + 1;
          _answer_rrs = (uint32_t *)((long)_answer_rrs + 6);
          offset._2_2_ = ntohs((uint16_t)*puVar4);
          if ((ttl != 0) && ((int)ofs_1 != 0)) {
            data = (uint16_t *)((long)data + 1);
            iVar2 = (*callback)((sockaddr *)_ret,MDNS_ENTRYTYPE_ANSWER,length,local_d0,offset._4_4_,
                                buffer,records,(long)_answer_rrs - (long)buffer,(size_t)offset._2_2_
                                ,(void *)addr._20_8_);
            if (iVar2 != 0) {
              ofs_1._0_4_ = 0;
            }
          }
          _answer_rrs = (uint32_t *)((long)_answer_rrs + (long)(int)(uint)offset._2_2_);
        }
        local_e0 = (long)_answer_rrs - (long)buffer;
        sVar5 = mdns_records_parse((sockaddr *)_ret,buffer,records,&local_e0,
                                   MDNS_ENTRYTYPE_AUTHORITY,(ulong)ofs._6_2_,callback,
                                   (void *)addr._20_8_);
        data = (uint16_t *)(sVar5 + (long)data);
        sStack_20 = mdns_records_parse((sockaddr *)_ret,buffer,records,&local_e0,
                                       MDNS_ENTRYTYPE_ADDITIONAL,(ulong)ofs._4_2_,callback,
                                       (void *)addr._20_8_);
        sStack_20 = sStack_20 + (long)data;
      }
      else {
        sStack_20 = 0;
      }
    }
    else {
      sStack_20 = 0;
    }
  }
  return sStack_20;
}

Assistant:

size_t
mdns_discovery_recv(int sock, void* buffer, size_t capacity,
                    mdns_record_callback_fn callback, void* user_data) {
	struct sockaddr_in6 addr;
	struct sockaddr* saddr = (struct sockaddr*)&addr;
	memset(&addr, 0, sizeof(addr));
	saddr->sa_family = AF_INET;
#ifdef __APPLE__
	saddr->sa_len = sizeof(addr);
#endif
	socklen_t addrlen = sizeof(addr);
	int ret = recvfrom(sock, buffer, capacity, 0,
	                   saddr, &addrlen);
	if (ret <= 0)
		return 0;

	size_t data_size = (size_t)ret;
	size_t records = 0;
	uint16_t* data = (uint16_t*)buffer;

	uint16_t transaction_id = ntohs(*data++);
	uint16_t flags          = ntohs(*data++);
	uint16_t questions      = ntohs(*data++);
	uint16_t answer_rrs     = ntohs(*data++);
	uint16_t authority_rrs  = ntohs(*data++);
	uint16_t additional_rrs = ntohs(*data++);

	if (transaction_id || (flags != 0x8400))
		return 0; //Not a reply to our question

	if (questions > 1)
		return 0;

	int i;
	for (i = 0; i < questions; ++i) {
		size_t ofs = (size_t)((char*)data - (char*)buffer);
		size_t verify_ofs = 12;
		//Verify it's our question, _services._dns-sd._udp.local.
		if (!mdns_string_equal(buffer, data_size, &ofs,
		                       mdns_services_query, sizeof(mdns_services_query), &verify_ofs))
			return 0;
		data = (uint16_t*)((char*)buffer + ofs);

		uint16_t type = ntohs(*data++);
		uint16_t rclass = ntohs(*data++);

		//Make sure we get a reply based on our PTR question for class IN
		if ((type != MDNS_RECORDTYPE_PTR) || ((rclass & 0x7FFF) != MDNS_CLASS_IN))
			return 0;
	}

	int do_callback = 1;
	for (i = 0; i < answer_rrs; ++i) {
		size_t ofs = (size_t)((char*)data - (char*)buffer);
		size_t verify_ofs = 12;
		//Verify it's an answer to our question, _services._dns-sd._udp.local.
		int is_answer = mdns_string_equal(buffer, data_size, &ofs,
		                                  mdns_services_query, sizeof(mdns_services_query), &verify_ofs);
		data = (uint16_t*)((char*)buffer + ofs);

		uint16_t type = ntohs(*data++);
		uint16_t rclass = ntohs(*data++);
		uint32_t ttl = ntohl(*(uint32_t*)(void*)data); data += 2;
		uint16_t length = ntohs(*data++);

		if (is_answer && do_callback) {
			++records;
			if (callback(saddr, MDNS_ENTRYTYPE_ANSWER, type, rclass, ttl, buffer,
			             data_size, (size_t)((char*)data - (char*)buffer), length,
			             user_data))
				do_callback = 0;
		}
		data = (uint16_t*)((char*)data + length);
	}

	size_t offset = (size_t)((char*)data - (char*)buffer);
	records += mdns_records_parse(saddr, buffer, data_size, &offset,
	                              MDNS_ENTRYTYPE_AUTHORITY, authority_rrs, 
	                              callback, user_data);
	records += mdns_records_parse(saddr, buffer, data_size, &offset,
	                              MDNS_ENTRYTYPE_ADDITIONAL, additional_rrs, 
	                              callback, user_data);

	return records;
}